

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorsForTest * __thiscall Catch::Context::getGeneratorsForCurrentTest(Context *this)

{
  long *plVar1;
  long *in_RDI;
  string testName;
  IGeneratorsForTest *generators;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
  *in_stack_ffffffffffffff68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>_>
  *this_00;
  Context *in_stack_ffffffffffffffd0;
  IGeneratorsForTest *local_10;
  
  local_10 = findGeneratorsForCurrentTest(in_stack_ffffffffffffffd0);
  if (local_10 == (IGeneratorsForTest *)0x0) {
    plVar1 = (long *)(**(code **)(*in_RDI + 0x10))();
    (**(code **)(*plVar1 + 0x40))(&stack0xffffffffffffffd0);
    local_10 = createGeneratorsForTest();
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>_>
               *)(in_RDI + 4);
    std::make_pair<std::__cxx11::string&,Catch::IGeneratorsForTest*&>
              (&in_stack_ffffffffffffff68->first,
               (IGeneratorsForTest **)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60))
    ;
    std::
    map<std::__cxx11::string,Catch::IGeneratorsForTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
    ::insert<std::pair<std::__cxx11::string,Catch::IGeneratorsForTest*>>
              (this_00,in_stack_ffffffffffffff68);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
             *)0x19c22d);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  }
  return local_10;
}

Assistant:

IGeneratorsForTest& getGeneratorsForCurrentTest() {
            IGeneratorsForTest* generators = findGeneratorsForCurrentTest();
            if( !generators ) {
                std::string testName = getResultCapture()->getCurrentTestName();
                generators = createGeneratorsForTest();
                m_generatorsByTestName.insert( std::make_pair( testName, generators ) );
            }
            return *generators;
        }